

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BinaryCache.cpp
# Opt level: O2

void BinaryCache::RemoveImportPath(char *path)

{
  char *pcVar1;
  undefined *puVar2;
  int iVar3;
  char **ppcVar4;
  uint index;
  
  index = 0;
  while( true ) {
    if (_DAT_0041bf3c <= index) {
      return;
    }
    ppcVar4 = FastVector<char_*,_false,_false>::operator[]
                        ((FastVector<char_*,_false,_false> *)&importPaths,index);
    iVar3 = strcmp(*ppcVar4,path);
    puVar2 = NULLC::dealloc;
    if (iVar3 == 0) break;
    index = index + 1;
  }
  ppcVar4 = FastVector<char_*,_false,_false>::operator[]
                      ((FastVector<char_*,_false,_false> *)&importPaths,index);
  (*(code *)puVar2)(*ppcVar4);
  ppcVar4 = FastVector<char_*,_false,_false>::back((FastVector<char_*,_false,_false> *)&importPaths)
  ;
  pcVar1 = *ppcVar4;
  ppcVar4 = FastVector<char_*,_false,_false>::operator[]
                      ((FastVector<char_*,_false,_false> *)&importPaths,index);
  *ppcVar4 = pcVar1;
  FastVector<char_*,_false,_false>::pop_back((FastVector<char_*,_false,_false> *)&importPaths);
  return;
}

Assistant:

void BinaryCache::RemoveImportPath(const char* path)
{
	for(unsigned int i = 0; i < importPaths.size(); i++)
	{
		if(strcmp(importPaths[i], path) == 0)
		{
			NULLC::dealloc(importPaths[i]);

			importPaths[i] = importPaths.back();
			importPaths.pop_back();
			return;
		}
	}
}